

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O3

void aom_highbd_dc_left_predictor_16x4_c
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  ulong uVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  int iVar5;
  uint16_t *puVar6;
  undefined4 uVar7;
  undefined1 auVar8 [16];
  
  uVar1 = *(ulong *)left;
  auVar2._8_4_ = 0;
  auVar2._0_8_ = uVar1;
  auVar2._12_2_ = (short)(uVar1 >> 0x30);
  auVar3._8_2_ = (short)(uVar1 >> 0x20);
  auVar3._0_8_ = uVar1;
  auVar3._10_4_ = auVar2._10_4_;
  auVar4._6_8_ = 0;
  auVar4._0_6_ = auVar3._8_6_;
  auVar8 = ZEXT416((auVar2._10_4_ >> 0x10) +
                   (int)CONCAT82(SUB148(auVar4 << 0x40,6),(short)(uVar1 >> 0x10)) +
                   auVar3._8_4_ + (uint)(ushort)uVar1 + 2 >> 2);
  auVar8 = pshuflw(auVar8,auVar8,0);
  uVar7 = auVar8._0_4_;
  puVar6 = dst + 8;
  iVar5 = 4;
  do {
    *(undefined4 *)(puVar6 + -8) = uVar7;
    *(undefined4 *)(puVar6 + -6) = uVar7;
    *(undefined4 *)(puVar6 + -4) = uVar7;
    *(undefined4 *)(puVar6 + -2) = uVar7;
    *(undefined4 *)puVar6 = uVar7;
    *(undefined4 *)(puVar6 + 2) = uVar7;
    *(undefined4 *)(puVar6 + 4) = uVar7;
    *(undefined4 *)(puVar6 + 6) = uVar7;
    puVar6 = puVar6 + stride;
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  return;
}

Assistant:

static inline void highbd_dc_left_predictor(uint16_t *dst, ptrdiff_t stride,
                                            int bw, int bh,
                                            const uint16_t *above,
                                            const uint16_t *left, int bd) {
  int i, r, expected_dc, sum = 0;
  (void)above;
  (void)bd;

  for (i = 0; i < bh; i++) sum += left[i];
  expected_dc = (sum + (bh >> 1)) / bh;

  for (r = 0; r < bh; r++) {
    aom_memset16(dst, expected_dc, bw);
    dst += stride;
  }
}